

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O1

void key_match(char **strs,int nstr,char **pattern,int exact,int *ikey,int *mkey)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  code *__compar;
  
  *mkey = -999;
  *ikey = -99;
  if (exact == 0) {
    __compar = compstrp;
  }
  else {
    __compar = compstre;
  }
  pvVar2 = bsearch(pattern,strs,(long)nstr,8,__compar);
  if (pvVar2 != (void *)0x0) {
    *mkey = 1;
    iVar4 = (int)((ulong)((long)pvVar2 - (long)strs) >> 3);
    *ikey = iVar4;
    if (1 < iVar4) {
      iVar4 = iVar4 + 1;
      pvVar3 = pvVar2;
      do {
        pvVar3 = (void *)((long)pvVar3 + -8);
        iVar1 = (*__compar)(pattern,pvVar3);
        if (iVar1 != 0) break;
        *mkey = *mkey + 1;
        *ikey = iVar4 + -2;
        iVar4 = iVar4 + -1;
      } while (2 < iVar4);
    }
    for (iVar4 = *mkey + *ikey; iVar4 < nstr; iVar4 = iVar4 + 1) {
      pvVar2 = (void *)((long)pvVar2 + 8);
      iVar1 = (*__compar)(pattern,pvVar2);
      if (iVar1 != 0) {
        return;
      }
      *mkey = *mkey + 1;
    }
  }
  return;
}

Assistant:

void key_match(char **strs,  	/* fits keyname  array */
             int nstr,		/* total number of keys */
             char **pattern,	/* wanted pattern  */ 
             int exact,		/* exact matching or pattern matching  
                                   exact = 1: exact matching.
                                   exact = 0: pattern matching. 
                                   Any keywords with "patten"* is included
                                */
                                
             int *ikey,		/* The element number of first key 
                                   Return -99 if not found */ 
             int *mkey		/* total number of key matched 
                                   return -999 if not found */
            )  			
{ 
     char **p;
     char **pi;
     int i;
     int (*fnpt)(const void *, const void *); 
     *mkey = -999;
     *ikey = -99;
     if(exact)  
	 fnpt = compstre;
     else 
         fnpt = compstrp;
     p = (char **)bsearch(pattern, strs, nstr,sizeof(char *), fnpt); 
     if(p) {	    
        *mkey = 1; 
        *ikey = p - strs; 
	pi = p;
	i = *ikey - 1;
	p--;
        while(i > 0 && !fnpt(pattern, p)) {*mkey += 1; *ikey =i; i--; p--;}
	p = pi;
	i = *ikey + *mkey;
        p++;
        while(i < nstr && !fnpt(pattern, p) ) {*mkey += 1; i++; p++;}
     }
     return;
}